

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

int __thiscall lscpp::comm_logger::open(comm_logger *this,char *__file,int __oflag,...)

{
  size_t sVar1;
  int iVar2;
  char *__filename;
  FILE *pFVar3;
  string local_58;
  undefined1 local_38 [8];
  string name;
  string *suffix_local;
  comm_logger *this_local;
  
  sVar1 = this->msg_id_;
  name.field_2._8_8_ = __file;
  std::__cxx11::string::string((string *)&local_58,(string *)__file);
  anon_unknown_0::filename((string *)local_38,(int)sVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"w");
  this->cur_file_ = (FILE *)pFVar3;
  this->file_open_ = true;
  this->msg_id_ = this->msg_id_ + 1;
  iVar2 = std::__cxx11::string::~string((string *)local_38);
  return iVar2;
}

Assistant:

void comm_logger::open(std::string suffix) {
  auto name = filename(msg_id_, suffix);
  cur_file_ = std::fopen(name.c_str(), "w");
  file_open_ = true;
  msg_id_++;
}